

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall Kompositum::Printer::visit(Printer *this,Composite *composite)

{
  bool bVar1;
  IDType IVar2;
  Composite *composite_local;
  Printer *this_local;
  
  doIndentation(this);
  this->indent = this->indent + 1;
  bVar1 = Composite::hasChildren(composite);
  if (bVar1) {
    IVar2 = Component::getID(&composite->super_Component);
    printf("+ Composite (%lu):\n",IVar2);
    Composite::visitChildren(composite,&this->super_Visitor);
  }
  else {
    IVar2 = Component::getID(&composite->super_Component);
    printf("- Composite (%lu): empty\n",IVar2);
  }
  this->indent = this->indent - 1;
  return;
}

Assistant:

void visit(Composite* composite) override {
        doIndentation();
        indent++;

        if (!composite->hasChildren()) {
            printf("- Composite (%lu): empty\n", composite->getID());
        } else {
            printf("+ Composite (%lu):\n", composite->getID());
            composite->visitChildren(*this);
        }

        indent--;
    }